

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
readValueAttributeComplete
          (UA_Server *server,UA_VariableNode *vn,UA_TimestampsToReturn timestamps,
          UA_String *indexRange,UA_DataValue *v)

{
  UA_StatusCode UVar1;
  UA_StatusCode local_54;
  UA_NumericRange *pUStack_50;
  UA_StatusCode retval;
  UA_NumericRange *rangeptr;
  UA_NumericRange range;
  UA_DataValue *v_local;
  UA_String *indexRange_local;
  UA_TimestampsToReturn timestamps_local;
  UA_VariableNode *vn_local;
  UA_Server *server_local;
  
  pUStack_50 = (UA_NumericRange *)0x0;
  range.dimensions = (UA_NumericRangeDimension *)v;
  if ((indexRange != (UA_String *)0x0) && (indexRange->length != 0)) {
    UVar1 = parse_numericrange(indexRange,(UA_NumericRange *)&rangeptr);
    if (UVar1 != 0) {
      return UVar1;
    }
    pUStack_50 = (UA_NumericRange *)&rangeptr;
  }
  if (vn->valueSource == UA_VALUESOURCE_DATA) {
    local_54 = readValueAttributeFromNode(server,vn,(UA_DataValue *)range.dimensions,pUStack_50);
  }
  else {
    local_54 = readValueAttributeFromDataSource
                         (vn,(UA_DataValue *)range.dimensions,timestamps,pUStack_50);
  }
  if (pUStack_50 != (UA_NumericRange *)0x0) {
    free((void *)range.dimensionsSize);
  }
  return local_54;
}

Assistant:

static UA_StatusCode
readValueAttributeComplete(UA_Server *server, const UA_VariableNode *vn,
                           UA_TimestampsToReturn timestamps, const UA_String *indexRange,
                           UA_DataValue *v) {
    /* Compute the index range */
    UA_NumericRange range;
    UA_NumericRange *rangeptr = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(indexRange && indexRange->length > 0) {
        retval = parse_numericrange(indexRange, &range);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        rangeptr = &range;
    }

    /* Read the value */
    if(vn->valueSource == UA_VALUESOURCE_DATA)
        retval = readValueAttributeFromNode(server, vn, v, rangeptr);
    else
        retval = readValueAttributeFromDataSource(vn, v, timestamps, rangeptr);

    /* Clean up */
    if(rangeptr)
        UA_free(range.dimensions);
    return retval;
}